

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O3

iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::find
          (iterator *__return_storage_ptr__,setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,
          key_type *k)

{
  int iVar1;
  int iVar2;
  treeNode<int> *ptVar3;
  treeNode<int> *ptVar4;
  treeNode<int> *ptVar5;
  treeNode<int> *ptVar6;
  treeNode<int> *ptVar7;
  long lVar8;
  
  ptVar3 = (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.NIL;
  ptVar7 = (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_root;
  ptVar4 = (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_first;
  ptVar5 = (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_last;
  ptVar6 = ptVar5;
  if ((ptVar5 != ptVar7 && ptVar4 != ptVar7) && (ptVar3 != ptVar7 && ptVar7 != (treeNode<int> *)0x0)
     ) {
    iVar1 = *k;
    while( true ) {
      iVar2 = ptVar7->value;
      ptVar6 = ptVar7;
      if (iVar1 == iVar2) break;
      lVar8 = 0x10;
      if ((iVar1 != iVar2 && iVar2 <= iVar1) || (lVar8 = 8, iVar1 < iVar2)) {
        ptVar7 = *(treeNode<int> **)((long)&ptVar7->value + lVar8);
      }
      ptVar6 = ptVar5;
      if ((((ptVar7 == (treeNode<int> *)0x0) || (ptVar3 == ptVar7)) || (ptVar4 == ptVar7)) ||
         (ptVar5 == ptVar7)) break;
    }
  }
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dd18;
  __return_storage_ptr__->m_tree =
       &(this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree;
  __return_storage_ptr__->m_node = ptVar6;
  return __return_storage_ptr__;
}

Assistant:

iterator		find(key_type const & k)
	{
		node*	node(this->root());
		while (this->validNode(node))
		{
			if (this->equal(node->value, k)) return iterator(this->m_tree, node);
			else if (this->key_comp()(node->value, k)) node = node->right;
			else if (this->key_comp()(k, node->value)) node = node->left;
		}
		return this->end();
	}